

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AddressFilter.cpp
# Opt level: O0

bool AddressFilter::AddressText(uint8_t *addr,size_t len,char *text,size_t text_max)

{
  char *pcVar1;
  bool local_29;
  bool ret;
  size_t text_max_local;
  char *text_local;
  size_t len_local;
  uint8_t *addr_local;
  
  if (len == 4) {
    pcVar1 = inet_ntop(2,addr,text,(socklen_t)text_max);
    local_29 = pcVar1 != (char *)0x0;
  }
  else if (len == 0x10) {
    pcVar1 = inet_ntop(10,addr,text,(socklen_t)text_max);
    local_29 = pcVar1 != (char *)0x0;
  }
  else {
    local_29 = false;
  }
  return local_29;
}

Assistant:

bool AddressFilter::AddressText(uint8_t * addr, size_t len, char * text, size_t text_max)
{
    bool ret = true;

    if (len == 4)
    {
        if (inet_ntop(AF_INET, addr, text, text_max) == NULL)
        {
            ret = false;
        }
    }
    else if (len == 16)
    {
        if (inet_ntop(AF_INET6, addr, text, text_max) == NULL)
        {
            ret = false;
        }
    }
    else
    {
        ret = false;
    }

    return ret;
}